

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControlPrivate::updateCurrentCharFormat(QWidgetTextControlPrivate *this)

{
  QObject *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  void *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  cVar2 = QTextFormat::operator==
                    ((QTextFormat *)&local_48,&(this->lastCharFormat).super_QTextFormat);
  if (cVar2 == '\0') {
    QTextFormat::operator=(&(this->lastCharFormat).super_QTextFormat,(QTextFormat *)&local_48);
    local_38 = (void *)0x0;
    puStack_30 = (undefined1 *)&local_48;
    QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,3,&local_38);
    QMetaObject::activate(pQVar1,&QWidgetTextControl::staticMetaObject,0xc,(void **)0x0);
  }
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::updateCurrentCharFormat()
{
    Q_Q(QWidgetTextControl);

    QTextCharFormat fmt = cursor.charFormat();
    if (fmt == lastCharFormat)
        return;
    lastCharFormat = fmt;

    emit q->currentCharFormatChanged(fmt);
    emit q->microFocusChanged();
}